

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wav_2D_decode(uint16_t *in,int nx,int ox,int ny,int oy,uint16_t mx)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t *a;
  uint16_t *b;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  uint16_t *in_RDI;
  int in_R8D;
  ushort in_R9W;
  uint16_t *p01_1;
  uint16_t *ex_1;
  uint16_t *px_1;
  uint16_t *p10_1;
  uint16_t *p11;
  uint16_t *p10;
  uint16_t *p01;
  uint16_t *ex;
  uint16_t *px;
  uint16_t i11;
  uint16_t i10;
  uint16_t i01;
  uint16_t i00;
  int ox2;
  int ox1;
  int oy2;
  int oy1;
  uint16_t *ey;
  uint16_t *py;
  int p2;
  int p;
  int n;
  int w14;
  uint local_a4;
  uint16_t *local_90;
  uint16_t *local_60;
  uint16_t local_58;
  uint16_t local_56;
  uint16_t local_54;
  uint16_t local_52;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint16_t *local_40;
  uint16_t *local_38;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_18;
  uint local_14;
  int local_10;
  uint local_c;
  uint16_t *local_8;
  
  local_20 = (uint)(in_R9W < 0x4000);
  local_a4 = in_ESI;
  if ((int)in_ECX < (int)in_ESI) {
    local_a4 = in_ECX;
  }
  local_24 = local_a4;
  for (local_28 = 1; (int)local_28 <= (int)local_a4; local_28 = local_28 << 1) {
  }
  local_2c = (int)local_28 >> 1;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_28 = (int)local_28 >> 2; 0 < (int)local_28; local_28 = (int)local_28 >> 1) {
    local_40 = local_8 + (int)(local_18 * (local_14 - local_2c));
    local_44 = local_18 * local_28;
    local_48 = local_18 * local_2c;
    local_4c = local_10 * local_28;
    local_50 = local_10 * local_2c;
    for (local_38 = local_8; local_38 <= local_40; local_38 = local_38 + local_48) {
      puVar1 = local_38 + (int)(local_10 * (local_c - local_2c));
      for (local_60 = local_38; local_60 <= puVar1; local_60 = local_60 + local_50) {
        puVar2 = local_60 + local_4c;
        a = local_60 + local_44;
        b = a + local_4c;
        if (local_20 == 0) {
          wdec16(*local_60,*a,&local_52,&local_56);
          wdec16(*puVar2,*b,&local_54,&local_58);
          wdec16(local_52,local_54,local_60,puVar2);
          wdec16(local_56,local_58,a,b);
        }
        else {
          wdec14_4(local_60,puVar2,a,b);
        }
      }
      if ((local_c & local_28) != 0) {
        puVar1 = local_60 + local_44;
        if (local_20 == 0) {
          wdec16(*local_60,*puVar1,&local_52,puVar1);
        }
        else {
          wdec14(*local_60,*puVar1,&local_52,puVar1);
        }
        *local_60 = local_52;
      }
    }
    if ((local_14 & local_28) != 0) {
      puVar1 = local_38 + (int)(local_10 * (local_c - local_2c));
      for (local_90 = local_38; local_90 <= puVar1; local_90 = local_90 + local_50) {
        puVar2 = local_90 + local_4c;
        if (local_20 == 0) {
          wdec16(*local_90,*puVar2,&local_52,puVar2);
        }
        else {
          wdec14(*local_90,*puVar2,&local_52,puVar2);
        }
        *local_90 = local_52;
      }
    }
    local_2c = local_28;
  }
  return;
}

Assistant:

static void
wav_2D_decode (
    uint16_t* in, // io: values are transformed in place
    int       nx, // i : x size
    int       ox, // i : x offset
    int       ny, // i : y size
    int       oy, // i : y offset
    uint16_t  mx)  // i : maximum in[x][y] value
{
    int w14 = (mx < (1 << 14)) ? 1 : 0;
    int n   = (nx > ny) ? ny : nx;
    int p   = 1;
    int p2;

    //
    // Search max level
    //

    while (p <= n)
        p <<= 1;

    p >>= 1;
    p2 = p;
    p >>= 1;

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p >= 1)
    {
        uint16_t* py  = in;
        uint16_t* ey  = in + oy * (ny - p2);
        int       oy1 = oy * p;
        int       oy2 = oy * p2;
        int       ox1 = ox * p;
        int       ox2 = ox * p2;
        uint16_t  i00, i01, i10, i11;

        //
        // Y loop
        //

        for (; py <= ey; py += oy2)
        {
            uint16_t* px = py;
            uint16_t* ex = py + ox * (nx - p2);

            //
            // X loop
            //

            for (; px <= ex; px += ox2)
            {
                uint16_t* p01 = px + ox1;
                uint16_t* p10 = px + oy1;
                uint16_t* p11 = p10 + ox1;

                //
                // 2D wavelet decoding
                //

                if (w14)
                {
                    wdec14_4 (px, p01, p10, p11);
                }
                else
                {
                    wdec16 (*px, *p10, &i00, &i10);
                    wdec16 (*p01, *p11, &i01, &i11);
                    wdec16 (i00, i01, px, p01);
                    wdec16 (i10, i11, p10, p11);
                }
            }

            //
            // Decode (1D) odd column (still in Y loop)
            //

            if (nx & p)
            {
                uint16_t* p10 = px + oy1;

                if (w14)
                    wdec14 (*px, *p10, &i00, p10);
                else
                    wdec16 (*px, *p10, &i00, p10);
                *px = i00;
            }
        }

        //
        // Decode (1D) odd line (must loop in X)
        //

        if (ny & p)
        {
            uint16_t* px = py;
            uint16_t* ex = py + ox * (nx - p2);

            for (; px <= ex; px += ox2)
            {
                uint16_t* p01 = px + ox1;

                if (w14)
                    wdec14 (*px, *p01, &i00, p01);
                else
                    wdec16 (*px, *p01, &i00, p01);
                *px = i00;
            }
        }

        //
        // Next level
        //

        p2 = p;
        p >>= 1;
    }
}